

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O1

void * tlp_cpld_data(tlp_cpl_hdr *ch)

{
  return (void *)((long)&ch[1].completer +
                 (ulong)(ch->lowaddr & 3) + (ulong)(((ch->tlp).fmt_type & 0x20) >> 5) * 4);
}

Assistant:

void *tlp_cpld_data(struct tlp_cpl_hdr *ch)
{
	void *p;

	p = tlp_is_3dw(ch->tlp.fmt_type) ?
		((char *)(ch + 1)) + 4 : ((char *)(ch + 1)) + 8;

	/* shift for padding due to 4DW alignment */
	p += (ch->lowaddr & 0x3);
	return p;
}